

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase489::run(TestCase489 *this)

{
  _func_int **pp_Var1;
  Reader reader;
  bool bVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  ArrayPtr<const_char> AVar3;
  undefined8 in_stack_fffffffffffffce8;
  int local_2d8;
  bool local_2d1;
  undefined1 auStack_2d0 [7];
  bool _kj_shouldLog_2;
  size_t local_2c8;
  bool local_2b9;
  undefined1 auStack_2b8 [7];
  bool _kj_shouldLog_1;
  size_t local_2b0;
  undefined1 local_2a8 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  undefined1 auStack_230 [8];
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  undefined1 local_1e8 [7];
  bool _kj_shouldLog;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> promise2;
  undefined1 local_198 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  request2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  undefined1 local_110 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  Client client;
  Client client2;
  Client local_98;
  undefined1 local_80 [8];
  Client client1;
  int callCount;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase489 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  client1._16_4_ = 0;
  kj::heap<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl,int&>
            ((kj *)&client2.field_0x10,(int *)&client1.field_0x10);
  DynamicCapability::Client::Client<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl,void>
            (&local_98,
             (Own<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl> *)&client2.field_0x10);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)local_80,&local_98.super_Client);
  DynamicCapability::Client::~Client(&local_98);
  kj::Own<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl> *)&client2.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::Client
            ((Client *)&client.field_0x10,(Client *)(local_80 + *(long *)((long)local_80 + -0x20)));
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&request1.hook.ptr,
             (Client *)(&client.field_0x10 + *(long *)(client._16_8_ + -0x18)));
  pp_Var1 = request1.hook.ptr[-4]._vptr_RequestHook;
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_110,(Client *)((long)&request1.hook.ptr + (long)pp_Var1),
             (Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_110,0x141);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&request2.hook.ptr,(int)local_110,__buf,in_RCX,in_R8D);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise2.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_198,(Client *)&request1.hook.ptr,
             (Maybe<capnp::MessageSize> *)&promise2.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise2.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_1e8,(int)local_198,__buf_00,in_RCX,in_R8D);
  if (client1._16_4_ != 0) {
    response2.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response2.hook.ptr._7_1_ != false) {
      response2.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x1fb,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response2.hook.ptr,
                 (int *)&client1.field_0x10);
      response2.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)auStack_230,
             local_1e8);
  response1.hook.ptr = (ResponseHook *)auStack_230;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffce8;
  checkTestMessage(reader);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_2a8,&request2.hook.ptr);
  _auStack_2b8 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_2a8);
  bVar2 = kj::operator==("bar",(StringPtr *)auStack_2b8);
  if (!bVar2) {
    local_2b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b9 != false) {
      AVar3 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_2a8);
      _auStack_2d0 = AVar3;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x203,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (response1.getX())\", \"bar\", response1.getX()"
                 ,(char (*) [47])"failed: expected (\"bar\") == (response1.getX())",
                 (char (*) [4])0xa54964,(Reader *)auStack_2d0);
      local_2b9 = false;
    }
  }
  if (client1._16_4_ != 2) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d1 != false) {
      local_2d8 = 2;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x205,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",&local_2d8,
                 (int *)&client1.field_0x10);
      local_2d1 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_2a8);
  Response<capnproto_test::capnp::test::TestAllTypes>::~Response
            ((Response<capnproto_test::capnp::test::TestAllTypes> *)auStack_230);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_1e8);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_198);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &request2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_110);
  capnproto_test::capnp::test::TestExtends::Client::~Client((Client *)&request1.hook.ptr);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)&client.field_0x10);
  capnproto_test::capnp::test::TestExtends::Client::~Client((Client *)local_80);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, DynamicServerInheritance) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestExtends::Client client1 =
      DynamicCapability::Client(kj::heap<TestExtendsDynamicImpl>(callCount))
          .castAs<test::TestExtends>();
  test::TestInterface::Client client2 = client1;
  auto client = client2.castAs<test::TestExtends>();

  auto request1 = client.fooRequest();
  request1.setI(321);
  auto promise1 = request1.send();

  auto request2 = client.graultRequest();
  auto promise2 = request2.send();

  EXPECT_EQ(0, callCount);

  auto response2 = promise2.wait(waitScope);

  checkTestMessage(response2);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("bar", response1.getX());

  EXPECT_EQ(2, callCount);
}